

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

void duckdb::StatsFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  _func_int **pp_Var1;
  BoundFunctionExpression *pBVar2;
  pointer pFVar3;
  _func_int **pp_Var4;
  Value v;
  string local_78;
  Value local_58;
  
  pBVar2 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar3 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar2->bind_info);
  pp_Var4 = pFVar3[2]._vptr_FunctionData;
  if (pp_Var4 == (_func_int **)0x0) {
    ::std::__cxx11::string::_M_replace((ulong)(pFVar3 + 1),0,(char *)0x0,0x1e1f139);
    pp_Var4 = pFVar3[2]._vptr_FunctionData;
  }
  pp_Var1 = pFVar3[1]._vptr_FunctionData;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pp_Var1,(long)pp_Var4 + (long)pp_Var1);
  Value::Value(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  Vector::Reference(result,&local_58);
  Value::~Value(&local_58);
  return;
}

Assistant:

static void StatsFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<StatsBindData>();
	if (info.stats.empty()) {
		info.stats = "No statistics";
	}
	Value v(info.stats);
	result.Reference(v);
}